

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LowerTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lowertriangular(NeuralNetworkLayer *this)

{
  bool bVar1;
  LowerTriangularLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_lowertriangular(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lowertriangular(this);
    this_00 = (LowerTriangularLayerParams *)operator_new(0x20);
    LowerTriangularLayerParams::LowerTriangularLayerParams(this_00);
    (this->layer_).lowertriangular_ = this_00;
  }
  return (LowerTriangularLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LowerTriangularLayerParams* NeuralNetworkLayer::mutable_lowertriangular() {
  if (!has_lowertriangular()) {
    clear_layer();
    set_has_lowertriangular();
    layer_.lowertriangular_ = new ::CoreML::Specification::LowerTriangularLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lowerTriangular)
  return layer_.lowertriangular_;
}